

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

bool obj_or_objects(Am_Value *v)

{
  bool bVar1;
  Am_Value *in_value;
  undefined1 local_38 [8];
  Am_Value lv;
  Am_Value_List l;
  Am_Value *v_local;
  
  bVar1 = Am_Value::Valid(v);
  if (bVar1) {
    if (v->type == 0xa001) {
      v_local._7_1_ = true;
    }
    else {
      bVar1 = Am_Value_List::Test(v);
      if (bVar1) {
        Am_Value_List::Am_Value_List((Am_Value_List *)&lv.value,v);
        Am_Value::Am_Value((Am_Value *)local_38);
        Am_Value_List::Start((Am_Value_List *)&lv.value);
        while( true ) {
          bVar1 = Am_Value_List::Last((Am_Value_List *)&lv.value);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          in_value = Am_Value_List::Get((Am_Value_List *)&lv.value);
          Am_Value::operator=((Am_Value *)local_38,in_value);
          if (local_38._0_2_ != 0xa001) {
            v_local._7_1_ = false;
            goto LAB_002a5391;
          }
          Am_Value_List::Next((Am_Value_List *)&lv.value);
        }
        v_local._7_1_ = true;
LAB_002a5391:
        Am_Value::~Am_Value((Am_Value *)local_38);
        Am_Value_List::~Am_Value_List((Am_Value_List *)&lv.value);
      }
      else {
        v_local._7_1_ = false;
      }
    }
  }
  else {
    v_local._7_1_ = false;
  }
  return v_local._7_1_;
}

Assistant:

bool
obj_or_objects(Am_Value &v)
{
  if (!v.Valid())
    return false;
  if (v.type == Am_OBJECT)
    return true;
  else if (Am_Value_List::Test(v)) {
    Am_Value_List l = v;
    Am_Value lv;
    for (l.Start(); !l.Last(); l.Next()) {
      lv = l.Get();
      if (lv.type != Am_OBJECT)
        return false;
    }
    return true;
  } else
    return false;
}